

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPML_CC_Unmarshal(TPML_CC *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT32 count;
  TPM_RC TVar2;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  TVar2 = 0x9a;
  if (3 < iVar1) {
    count = ByteArrayToUint32(*buffer);
    target->count = count;
    *buffer = *buffer + 4;
    TVar2 = 0x95;
    if (count < 0xff) {
      TVar2 = TPM_CC_Array_Unmarshal(target->commandCodes,buffer,size,count);
      return TVar2;
    }
  }
  return TVar2;
}

Assistant:

TPM_RC UINT32_Unmarshal(UINT32 *target, BYTE **buffer, INT32 *size)
{
    TPM_RC result;
    if ((*size -= 4) < 0)
    {
        result = TPM_RC_INSUFFICIENT;
    }
    else
    {
        *target = BYTE_ARRAY_TO_UINT32(*buffer);
        *buffer += 4;
        result = TPM_RC_SUCCESS;
    }
    return result;
}